

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

StorageClass __thiscall
spvtools::val::Instruction::GetOperandAs<spv::StorageClass>(Instruction *this,size_t index)

{
  uint __line;
  const_reference pvVar1;
  char *__assertion;
  
  pvVar1 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::at
                     (&this->operands_,index);
  if (pvVar1->num_words == 0) {
    __assertion = "o.num_words * 4 >= sizeof(T)";
    __line = 0x69;
  }
  else {
    if ((uint)pvVar1->num_words + (uint)pvVar1->offset <= (uint)(this->inst_).num_words) {
      return (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[pvVar1->offset];
    }
    __assertion = "o.offset + o.num_words <= inst_.num_words";
    __line = 0x6a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/instruction.h"
                ,__line,
                "T spvtools::val::Instruction::GetOperandAs(size_t) const [T = spv::StorageClass]");
}

Assistant:

T GetOperandAs(size_t index) const {
    const spv_parsed_operand_t& o = operands_.at(index);
    assert(o.num_words * 4 >= sizeof(T));
    assert(o.offset + o.num_words <= inst_.num_words);
    return *reinterpret_cast<const T*>(&words_[o.offset]);
  }